

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void CountTest<uttt::IBoard>(int depth)

{
  ostream *poVar1;
  int iVar2;
  int depth_00;
  IBoard local_48;
  
  if (0 < depth) {
    depth_00 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Working on depth: ",0x12);
      iVar2 = depth_00 + 1;
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
      local_48.macro._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_48,1);
      std::chrono::_V2::system_clock::now();
      uttt::IBoard::IBoard(&local_48);
      game::Count_<uttt::IBoard>(&local_48,depth_00);
      std::chrono::_V2::system_clock::now();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Count: ",7);
      poVar1 = std::ostream::_M_insert<long_long>((longlong)&std::cout);
      local_48.macro._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_48,1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Duration: ",10);
      poVar1 = std::ostream::_M_insert<long_long>((longlong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," seconds ",9);
      poVar1 = std::ostream::_M_insert<long_long>((longlong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," milliseconds\n",0xe);
      std::chrono::_V2::system_clock::now();
      game::CountBFS<uttt::IBoard>(depth_00);
      std::chrono::_V2::system_clock::now();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"DFS count: ",0xb);
      poVar1 = std::ostream::_M_insert<long_long>((longlong)&std::cout);
      local_48.macro._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)&local_48,1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Duration: ",10);
      poVar1 = std::ostream::_M_insert<long_long>((longlong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," seconds ",9);
      poVar1 = std::ostream::_M_insert<long_long>((longlong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1," milliseconds\n",0xe);
      depth_00 = iVar2;
    } while (depth != iVar2);
  }
  return;
}

Assistant:

void
CountTest(int depth)
{
    for (int i = 0; i < depth; ++i)
    {
        std::cout << "Working on depth: " << i + 1 << '\n';

        auto t1 = std::chrono::high_resolution_clock::now();
        auto r = game::Count<IGame>(i);
        auto t2 = std::chrono::high_resolution_clock::now();
        long long millis = std::chrono::duration_cast<std::chrono::milliseconds>(t2 - t1).count();
        std::cout << "Count: " << r << '\n';
        std::cout << "Duration: " << millis / 1000 << " seconds " << millis % 1000 << " milliseconds\n";

        t1 = std::chrono::high_resolution_clock::now();
        auto count = game::CountBFS<IGame>(i);
        t2 = std::chrono::high_resolution_clock::now();
        std::cout << "DFS count: " << count << '\n';
        millis = std::chrono::duration_cast<std::chrono::milliseconds>(t2 - t1).count();
        std::cout << "Duration: " << millis / 1000 << " seconds " << millis % 1000 << " milliseconds\n";
    }
}